

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffpdat(fitsfile *fptr,int *status)

{
  char local_a8 [8];
  char card [81];
  char tmzone [10];
  char date [30];
  int timeref;
  int *status_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    ffgstm(tmzone + 2,(int *)(date + 0x1c),status);
    if (stack0xffffffffffffffdc == 0) {
      strcpy(card + 0x4e," UT");
    }
    else {
      strcpy(card + 0x4e," Local");
    }
    strcpy(local_a8,"DATE    = \'");
    strcat(local_a8,tmzone + 2);
    strcat(local_a8,"\' / file creation date (YYYY-MM-DDThh:mm:ss");
    strcat(local_a8,card + 0x4e);
    strcat(local_a8,")");
    ffucrd(fptr,"DATE",local_a8,status);
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpdat( fitsfile *fptr,      /* I - FITS file pointer  */
            int   *status)       /* IO - error status      */
/*
  Write the DATE keyword into the FITS header.  If the keyword already
  exists then the date will simply be updated in the existing keyword.
*/
{
    int timeref;
    char date[30], tmzone[10], card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    ffgstm(date, &timeref, status);

    if (timeref)           /* GMT not available on this machine */
        strcpy(tmzone, " Local");    
    else
        strcpy(tmzone, " UT");    

    strcpy(card, "DATE    = '");
    strcat(card, date);
    strcat(card, "' / file creation date (YYYY-MM-DDThh:mm:ss");
    strcat(card, tmzone);
    strcat(card, ")");

    ffucrd(fptr, "DATE", card, status);

    return(*status);
}